

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
          (QMovableArrayOps<QUrl> *this,qsizetype i,QUrl *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QUrl *pQVar4;
  Inserter *in_RDX;
  QUrl *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QUrl tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  Inserter local_38;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QUrl>::needsDetach((QArrayDataPointer<QUrl> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QUrl>::freeSpaceAtEnd
                          ((QArrayDataPointer<QUrl> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QUrl>::end((QArrayDataPointer<QUrl> *)in_RDI);
      QUrl::QUrl(pQVar4,(QUrl *)in_RDX);
      in_RDI->displaceTo = (QUrl *)((long)&in_RDI->displaceTo->d + 1);
      goto LAB_003c4aca;
    }
    if ((in_RSI == (QUrl *)0x0) &&
       (qVar3 = QArrayDataPointer<QUrl>::freeSpaceAtBegin
                          ((QArrayDataPointer<QUrl> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QUrl>::begin((QArrayDataPointer<QUrl> *)0x3c49a4);
      QUrl::QUrl(pQVar4 + -1,(QUrl *)in_RDX);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QUrl *)((long)&in_RDI->displaceTo->d + 1);
      goto LAB_003c4aca;
    }
  }
  local_10.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_10,(QUrl *)in_RDX);
  bVar5 = in_RDI->displaceTo != (QUrl *)0x0;
  uVar6 = bVar5 && in_RSI == (QUrl *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QUrl *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QUrl>::detachAndGrow
            ((QArrayDataPointer<QUrl> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QUrl **)CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QUrl> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QUrl> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QUrl *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(&local_38);
  }
  else {
    pQVar4 = QArrayDataPointer<QUrl>::begin((QArrayDataPointer<QUrl> *)0x3c4a5e);
    QUrl::QUrl(pQVar4 + -1,&local_10);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QUrl *)((long)&in_RDI->displaceTo->d + 1);
  }
  QUrl::~QUrl(&local_10);
LAB_003c4aca:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }